

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void init_descriptor(int control)

{
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  int *piVar4;
  char *pcVar5;
  int in_EDI;
  int addr;
  int size;
  int desc;
  hostent *from;
  sockaddr_in sock;
  DESCRIPTOR_DATA *dnew;
  char buf [4608];
  DESCRIPTOR_DATA *in_stack_ffffffffffffed30;
  char *in_stack_ffffffffffffed38;
  undefined4 in_stack_ffffffffffffed40;
  int in_stack_ffffffffffffed44;
  uint in_stack_ffffffffffffed48;
  uint in_stack_ffffffffffffed4c;
  uint in_stack_ffffffffffffed50;
  uint in_stack_ffffffffffffed54;
  char *in_stack_ffffffffffffed58;
  int in_stack_ffffffffffffed60;
  undefined4 in_stack_ffffffffffffed64;
  undefined4 in_stack_ffffffffffffed68;
  undefined4 in_stack_ffffffffffffed6c;
  int *in_stack_ffffffffffffed70;
  CLogger *in_stack_ffffffffffffed78;
  size_t in_stack_ffffffffffffed80;
  char *in_stack_ffffffffffffed88;
  int *in_stack_ffffffffffffedc0;
  socklen_t local_1230;
  int local_122c;
  hostent *local_1228;
  sockaddr local_1220;
  DESCRIPTOR_DATA *local_1210;
  char local_1208 [4544];
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  
  local_1230 = 0x10;
  getsockname(in_EDI,&local_1220,&local_1230);
  local_122c = accept(in_EDI,&local_1220,&local_1230);
  if (local_122c < 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
               in_stack_ffffffffffffed38);
    piVar4 = __errno_location();
    strerror(*piVar4);
    fmt_00._M_str = (char *)in_stack_ffffffffffffed78;
    fmt_00._M_len = (size_t)in_stack_ffffffffffffed70;
    CLogger::Warn<char*>
              ((CLogger *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68),fmt_00,
               (char **)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60));
  }
  else {
    iVar2 = fcntl(local_122c,4,0x800);
    if (iVar2 == -1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                 in_stack_ffffffffffffed38);
      piVar4 = __errno_location();
      strerror(*piVar4);
      fmt_01._M_str = (char *)in_stack_ffffffffffffed78;
      fmt_01._M_len = (size_t)in_stack_ffffffffffffed70;
      CLogger::Warn<char*>
                ((CLogger *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68),fmt_01,
                 (char **)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60));
    }
    else {
      iVar2 = fcntl(local_122c,4,0x800);
      if (iVar2 == -1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                   in_stack_ffffffffffffed38);
        piVar4 = __errno_location();
        strerror(*piVar4);
        fmt_02._M_str = (char *)in_stack_ffffffffffffed78;
        fmt_02._M_len = (size_t)in_stack_ffffffffffffed70;
        CLogger::Warn<char*>
                  ((CLogger *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68),fmt_02,
                   (char **)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60));
      }
      else {
        local_1210 = new_descriptor();
        local_1210->descriptor = (short)local_122c;
        local_1210->connected = 1;
        local_1210->showstr_head = (char *)0x0;
        local_1210->showstr_point = (char *)0x0;
        local_1210->outsize = 2000;
        local_1210->pEdit = (void *)0x0;
        local_1210->pString = (char **)0x0;
        local_1210->editor = 0;
        pcVar5 = (char *)operator_new__((long)local_1210->outsize);
        local_1210->outbuf = pcVar5;
        local_1210->outtop = 0;
        local_1230 = 0x10;
        iVar2 = getpeername(local_122c,&local_1220,&local_1230);
        if (iVar2 < 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                     in_stack_ffffffffffffed38);
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          fmt_03._M_str = (char *)in_stack_ffffffffffffed78;
          fmt_03._M_len = (size_t)pcVar5;
          CLogger::Warn<char*>
                    ((CLogger *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68),fmt_03
                     ,(char **)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60));
          pcVar5 = palloc_string(in_stack_ffffffffffffed58);
          local_1210->host = pcVar5;
        }
        else {
          uVar3 = ntohl(local_1220.sa_data._2_4_);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                     in_stack_ffffffffffffed38);
          in_stack_ffffffffffffed54 = (int)uVar3 >> 0x18 & 0xff;
          in_stack_ffffffffffffed50 = (int)uVar3 >> 0x10 & 0xff;
          in_stack_ffffffffffffed4c = (int)uVar3 >> 8 & 0xff;
          in_stack_ffffffffffffed48 = uVar3 & 0xff;
          fmt_04._M_str = in_stack_ffffffffffffed88;
          fmt_04._M_len = in_stack_ffffffffffffed80;
          CLogger::Info<int,int,int,int>
                    (in_stack_ffffffffffffed78,fmt_04,in_stack_ffffffffffffed70,
                     (int *)CONCAT44(uVar3,in_stack_ffffffffffffed68),
                     (int *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                     in_stack_ffffffffffffedc0);
          pcVar5 = strstr(local_1208,"204.82.56.");
          if (pcVar5 != (char *)0x0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                       in_stack_ffffffffffffed38);
            fmt._M_str._0_4_ = in_stack_ffffffffffffed60;
            fmt._M_len = (size_t)in_stack_ffffffffffffed58;
            fmt._M_str._4_4_ = in_stack_ffffffffffffed64;
            CLogger::Info<>((CLogger *)CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50)
                            ,fmt);
            write_to_descriptor(in_stack_ffffffffffffed60,in_stack_ffffffffffffed58,
                                in_stack_ffffffffffffed54);
            close(local_122c);
            free_descriptor(in_stack_ffffffffffffed30);
            return;
          }
          local_1228 = gethostbyaddr(local_1220.sa_data + 2,4,2);
          if (local_1228 == (hostent *)0x0) {
            pcVar5 = palloc_string(in_stack_ffffffffffffed58);
            local_1210->host = pcVar5;
            local_1210->type = 1;
          }
          else {
            pcVar5 = palloc_string(in_stack_ffffffffffffed58);
            local_1210->host = pcVar5;
            local_1210->type = 0;
          }
        }
        bVar1 = check_ban(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                          in_stack_ffffffffffffffb8);
        if (bVar1) {
          write_to_descriptor(in_stack_ffffffffffffed60,in_stack_ffffffffffffed58,
                              in_stack_ffffffffffffed54);
          close(local_122c);
          free_descriptor(in_stack_ffffffffffffed30);
        }
        else {
          local_1210->next = descriptor_list;
          descriptor_list = local_1210;
          if (*help_greeting == '.') {
            write_to_buffer((DESCRIPTOR_DATA *)
                            CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50),
                            (char *)CONCAT44(in_stack_ffffffffffffed4c,in_stack_ffffffffffffed48),
                            in_stack_ffffffffffffed44);
          }
          else {
            write_to_buffer((DESCRIPTOR_DATA *)
                            CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50),
                            (char *)CONCAT44(in_stack_ffffffffffffed4c,in_stack_ffffffffffffed48),
                            in_stack_ffffffffffffed44);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void init_descriptor(int control)
{
	char buf[MAX_STRING_LENGTH];
	DESCRIPTOR_DATA *dnew;
	struct sockaddr_in sock;
	struct hostent *from;
	int desc;
	int size;

	size = sizeof(sock);
	getsockname(control, (struct sockaddr *)&sock, (socklen_t *)&size);

	if ((desc = accept(control, (struct sockaddr *)&sock, (socklen_t *)&size)) < 0)
	{
		RS.Logger.Warn("Init_descriptor: accept: {}", std::strerror(errno));
		return;
	}

	if (fcntl(desc, F_SETFL, FNDELAY) == -1)
	{
		RS.Logger.Warn("Init_descriptor: fcntl FNDELAY: {}", std::strerror(errno));
		return;
	}

#ifndef _WIN32  /* windows doesn't lock files like this so we should be able to bypass */
	if (fcntl(desc, F_SETFL, FNDELAY) == -1)
	{
		RS.Logger.Warn("Init_descriptor: fcntl FNDELAY: {}", std::strerror(errno));
		return;
	}
#endif

	/*
	 * Cons a new descriptor.
	 */
	dnew = new_descriptor();
	dnew->descriptor = desc;
	dnew->connected = CON_GET_NAME;
	dnew->showstr_head = nullptr;
	dnew->showstr_point = nullptr;
	dnew->outsize = 2000;
	dnew->pEdit = nullptr;	  /* OLC */
	dnew->pString = nullptr; /* OLC */
	dnew->editor = 0;	  /* OLC */
	dnew->outbuf = new char[dnew->outsize];
	dnew->outtop = 0;

	size = sizeof(sock);

	if (getpeername(desc, (struct sockaddr *)&sock, (socklen_t *)&size) < 0)
	{
		RS.Logger.Warn("Init_descriptor: getpeername: {}", std::strerror(errno));
		dnew->host = palloc_string("(unknown)");
	}
	else
	{
		/*
		 * Would be nice to use inet_ntoa here but it takes a struct arg,
		 * which ain't very compatible between gcc and system libraries.
		 */
		int addr;

		addr = ntohl(sock.sin_addr.s_addr);

		RS.Logger.Info("Sock.sinaddr:  {}.{}.{}.{}", (addr >> 24) & 0xFF, (addr >> 16) & 0xFF, (addr >> 8) & 0xFF, (addr)&0xFF);

		if (strstr(buf, "204.82.56."))
		{
			RS.Logger.Info("DNS lookup refused. Forbidding access.");
			write_to_descriptor(desc, "Your site has been banned from this mud due to DNS problems.\n\r", 0);

			close(desc);
			free_descriptor(dnew);
			return;
		}

		if ((from = gethostbyaddr((char *)&sock.sin_addr, sizeof(sock.sin_addr), AF_INET)) != nullptr)
		{
			dnew->host = palloc_string(from->h_name);
			dnew->type = 0;
		}
		else
		{
			dnew->host = palloc_string(buf);
			dnew->type = 1;
		}
	}

	/*
	 * Swiftest: I added the following to ban sites.  I don't
	 * endorse banning of sites, but Copper has few descriptors now
	 * and some people from certain sites keep abusing access by
	 * using automated 'autodialers' and leaving connections hanging.
	 *
	 * Furey: added suffix check by request of Nickel of HiddenWorlds.
	 */
	if (check_ban(dnew->host, NBAN_ALL, dnew->type))
	{
		write_to_descriptor(desc, "Your site has been banned from this mud.\n\r", 0);

		close(desc);
		free_descriptor(dnew);
		return;
	}
	/*
	 * Init descriptor data.
	 */
	dnew->next = descriptor_list;
	descriptor_list = dnew;

	/*
	 * Send the greeting.
	 */
	{
		if (help_greeting[0] == '.')
			write_to_buffer(dnew, help_greeting + 1, 0);
		else
			write_to_buffer(dnew, help_greeting, 0);
	}
}